

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cc
# Opt level: O2

bool __thiscall draco::PointCloud::DeduplicateAttributeValues(PointCloud *this)

{
  pointer puVar1;
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> this_00;
  ValueType VVar2;
  long lVar3;
  bool bVar4;
  int32_t att_id;
  long lVar5;
  
  if (this->num_points_ == 0) {
    bVar4 = true;
  }
  else {
    lVar5 = 0;
    do {
      puVar1 = (this->attributes_).
               super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = (long)(int)((ulong)((long)(this->attributes_).
                                        super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1)
                         >> 3);
      bVar4 = lVar3 <= lVar5;
      if (lVar3 <= lVar5) {
        return bVar4;
      }
      this_00._M_t.
      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
      super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
           puVar1[lVar5]._M_t.
           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
           ._M_t;
      VVar2 = PointAttribute::DeduplicateValues
                        ((PointAttribute *)
                         this_00._M_t.
                         super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                         .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl,
                         (GeometryAttribute *)
                         this_00._M_t.
                         super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                         .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl);
      lVar5 = lVar5 + 1;
    } while (VVar2 != 0);
  }
  return bVar4;
}

Assistant:

bool PointCloud::DeduplicateAttributeValues() {
  // Go over all attributes and create mapping between duplicate entries.
  if (num_points() == 0) {
    return true;  // Nothing to deduplicate.
  }
  // Deduplicate all attributes.
  for (int32_t att_id = 0; att_id < num_attributes(); ++att_id) {
    if (!attribute(att_id)->DeduplicateValues(*attribute(att_id))) {
      return false;
    }
  }
  return true;
}